

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O2

void __thiscall WindowPrivate::WindowPrivate(WindowPrivate *this,Window *parent)

{
  this->q = parent;
  this->stack = (QStackedWidget *)0x0;
  this->imageList = (ImageList *)0x0;
  (this->imageFiles).d.d = (Data *)0x0;
  (this->imageFiles).d.ptr = (QString *)0x0;
  (this->imageFiles).d.size = 0;
  this->futureWatcher = (QFutureWatcher<QImage> *)0x0;
  QFutureInterface<QImage>::canceledResult();
  QFutureInterface<QList<QString>_>::canceledResult();
  (this->imageLocations).d.ptr = (QString *)0x0;
  (this->imageLocations).d.size = 0;
  this->filesFutureWatcher = (QFutureWatcher<QList<QString>_> *)0x0;
  (this->imageLocations).d.d = (Data *)0x0;
  return;
}

Assistant:

WindowPrivate( Window * parent )
		:	q( parent )
		,	stack( 0 )
		,	imageList( 0 )
		,	futureWatcher( 0 )
		,	filesFutureWatcher( 0 )
	{
	}